

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
ExceptionOr(ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
            *this,OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *value)

{
  (this->super_ExceptionOrValue).exception.ptr.isSet = false;
  NullableValue<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
  NullableValue(&(this->value).ptr,value);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}